

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::F_formatter::format(F_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  bool bVar1;
  unsigned_long uVar2;
  undefined1 local_60 [8];
  scoped_pad p;
  size_t field_size;
  duration<long,_std::ratio<1L,_1000000000L>_> ns;
  memory_buffer *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  F_formatter *this_local;
  
  ns.__r = (rep)dest;
  field_size = (size_t)fmt_helper::
                       time_fraction<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                                 (&msg->time);
  bVar1 = padding_info::enabled(&(this->super_flag_formatter).padinfo_);
  if (bVar1) {
    p.spaces_._M_str = (char *)0x9;
    scoped_pad::scoped_pad
              ((scoped_pad *)local_60,9,&(this->super_flag_formatter).padinfo_,
               (memory_buffer *)ns.__r);
    uVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&field_size);
    fmt_helper::pad9<unsigned_long,500ul>
              (uVar2,(basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)ns.__r);
    scoped_pad::~scoped_pad((scoped_pad *)local_60);
  }
  else {
    uVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&field_size);
    fmt_helper::pad9<unsigned_long,500ul>
              (uVar2,(basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)ns.__r);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        auto ns = fmt_helper::time_fraction<std::chrono::nanoseconds>(msg.time);
        if (padinfo_.enabled())
        {
            const size_t field_size = 9;
            scoped_pad p(field_size, padinfo_, dest);
            fmt_helper::pad9(static_cast<size_t>(ns.count()), dest);
        }
        else
        {
            fmt_helper::pad9(static_cast<size_t>(ns.count()), dest);
        }
    }